

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O2

void __thiscall
afsm::actions::detail::
action_invocation<afsm::test::transit_action,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction::tran_error,afsm::test::connection_fsm_def::transaction::exiting>
::operator()(action_invocation<afsm::test::transit_action,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction::tran_error,afsm::test::connection_fsm_def::transaction::exiting>
             *this,ready_for_query *event,
            inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
            *fsm,tran_error *source,exiting *target)

{
  action_invocation_impl<afsm::test::transit_action,_afsm::test::events::ready_for_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction::tran_error,_afsm::test::connection_fsm_def::transaction::exiting,_true>
  local_1;
  
  action_invocation_impl<afsm::test::transit_action,_afsm::test::events::ready_for_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction::tran_error,_afsm::test::connection_fsm_def::transaction::exiting,_true>
  ::operator()(&local_1,event,fsm,source,target);
  return;
}

Assistant:

void
    operator()(Event&& event, FSM& fsm, SourceState& source, TargetState& target) const
    {
        using invocation_type = action_invocation_impl<
                                    Action, Event, FSM,
                                    SourceState, TargetState,
                                    action_long_signature<Action, Event, FSM,
                                            SourceState, TargetState>::value>;
        invocation_type{}(::std::forward<Event>(event), fsm, source, target);
    }